

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_acbp_v2.cpp
# Opt level: O0

void __thiscall intel_acbp_v2_t::acbp_element_t::_read(acbp_element_t *this)

{
  kstream *this_00;
  uint16_t uVar1;
  header_t *phVar2;
  structure_ids_t sVar3;
  ibbs_body_t *this_01;
  pmda_body_t *this_02;
  string local_58;
  unique_ptr<intel_acbp_v2_t::pmda_body_t,_std::default_delete<intel_acbp_v2_t::pmda_body_t>_>
  local_38;
  unique_ptr<intel_acbp_v2_t::ibbs_body_t,_std::default_delete<intel_acbp_v2_t::ibbs_body_t>_>
  local_30 [3];
  unique_ptr<intel_acbp_v2_t::header_t,_std::default_delete<intel_acbp_v2_t::header_t>_> local_18;
  acbp_element_t *local_10;
  acbp_element_t *this_local;
  
  local_10 = this;
  phVar2 = (header_t *)operator_new(0x30);
  header_t::header_t(phVar2,(this->super_kstruct).m__io,this,this->m__root);
  std::unique_ptr<intel_acbp_v2_t::header_t,std::default_delete<intel_acbp_v2_t::header_t>>::
  unique_ptr<std::default_delete<intel_acbp_v2_t::header_t>,void>
            ((unique_ptr<intel_acbp_v2_t::header_t,std::default_delete<intel_acbp_v2_t::header_t>> *
             )&local_18,phVar2);
  std::unique_ptr<intel_acbp_v2_t::header_t,_std::default_delete<intel_acbp_v2_t::header_t>_>::
  operator=(&this->m_header,&local_18);
  std::unique_ptr<intel_acbp_v2_t::header_t,_std::default_delete<intel_acbp_v2_t::header_t>_>::
  ~unique_ptr(&local_18);
  this->n_ibbs_body = true;
  phVar2 = header(this);
  sVar3 = header_t::structure_id(phVar2);
  if (sVar3 == STRUCTURE_IDS_IBBS) {
    phVar2 = header(this);
    uVar1 = header_t::total_size(phVar2);
    if (0xb < uVar1) {
      this->n_ibbs_body = false;
      this_01 = (ibbs_body_t *)operator_new(0x88);
      ibbs_body_t::ibbs_body_t(this_01,(this->super_kstruct).m__io,this,this->m__root);
      std::
      unique_ptr<intel_acbp_v2_t::ibbs_body_t,std::default_delete<intel_acbp_v2_t::ibbs_body_t>>::
      unique_ptr<std::default_delete<intel_acbp_v2_t::ibbs_body_t>,void>
                ((unique_ptr<intel_acbp_v2_t::ibbs_body_t,std::default_delete<intel_acbp_v2_t::ibbs_body_t>>
                  *)local_30,this_01);
      std::
      unique_ptr<intel_acbp_v2_t::ibbs_body_t,_std::default_delete<intel_acbp_v2_t::ibbs_body_t>_>::
      operator=(&this->m_ibbs_body,local_30);
      std::
      unique_ptr<intel_acbp_v2_t::ibbs_body_t,_std::default_delete<intel_acbp_v2_t::ibbs_body_t>_>::
      ~unique_ptr(local_30);
    }
  }
  this->n_pmda_body = true;
  phVar2 = header(this);
  sVar3 = header_t::structure_id(phVar2);
  if (sVar3 == STRUCTURE_IDS_PMDA) {
    phVar2 = header(this);
    uVar1 = header_t::total_size(phVar2);
    if (0xb < uVar1) {
      this->n_pmda_body = false;
      this_02 = (pmda_body_t *)operator_new(0x38);
      pmda_body_t::pmda_body_t(this_02,(this->super_kstruct).m__io,this,this->m__root);
      std::
      unique_ptr<intel_acbp_v2_t::pmda_body_t,std::default_delete<intel_acbp_v2_t::pmda_body_t>>::
      unique_ptr<std::default_delete<intel_acbp_v2_t::pmda_body_t>,void>
                ((unique_ptr<intel_acbp_v2_t::pmda_body_t,std::default_delete<intel_acbp_v2_t::pmda_body_t>>
                  *)&local_38,this_02);
      std::
      unique_ptr<intel_acbp_v2_t::pmda_body_t,_std::default_delete<intel_acbp_v2_t::pmda_body_t>_>::
      operator=(&this->m_pmda_body,&local_38);
      std::
      unique_ptr<intel_acbp_v2_t::pmda_body_t,_std::default_delete<intel_acbp_v2_t::pmda_body_t>_>::
      ~unique_ptr(&local_38);
    }
  }
  this->n_generic_body = true;
  phVar2 = header(this);
  sVar3 = header_t::structure_id(phVar2);
  if (sVar3 != STRUCTURE_IDS_IBBS) {
    phVar2 = header(this);
    sVar3 = header_t::structure_id(phVar2);
    if (sVar3 != STRUCTURE_IDS_PMDA) {
      phVar2 = header(this);
      uVar1 = header_t::total_size(phVar2);
      if (0xb < uVar1) {
        this->n_generic_body = false;
        this_00 = (this->super_kstruct).m__io;
        phVar2 = header(this);
        uVar1 = header_t::total_size(phVar2);
        kaitai::kstream::read_bytes_abi_cxx11_(&local_58,this_00,(long)(int)(uVar1 - 0xc));
        std::__cxx11::string::operator=((string *)&this->m_generic_body,(string *)&local_58);
        std::__cxx11::string::~string((string *)&local_58);
      }
    }
  }
  return;
}

Assistant:

void intel_acbp_v2_t::acbp_element_t::_read() {
    m_header = std::unique_ptr<header_t>(new header_t(m__io, this, m__root));
    n_ibbs_body = true;
    if ( ((header()->structure_id() == intel_acbp_v2_t::STRUCTURE_IDS_IBBS) && (header()->total_size() >= 12)) ) {
        n_ibbs_body = false;
        m_ibbs_body = std::unique_ptr<ibbs_body_t>(new ibbs_body_t(m__io, this, m__root));
    }
    n_pmda_body = true;
    if ( ((header()->structure_id() == intel_acbp_v2_t::STRUCTURE_IDS_PMDA) && (header()->total_size() >= 12)) ) {
        n_pmda_body = false;
        m_pmda_body = std::unique_ptr<pmda_body_t>(new pmda_body_t(m__io, this, m__root));
    }
    n_generic_body = true;
    if ( ((header()->structure_id() != intel_acbp_v2_t::STRUCTURE_IDS_IBBS) && (header()->structure_id() != intel_acbp_v2_t::STRUCTURE_IDS_PMDA) && (header()->total_size() >= 12)) ) {
        n_generic_body = false;
        m_generic_body = m__io->read_bytes((header()->total_size() - 12));
    }
}